

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void runputbuf(uchar *dstp,runsdef *val)

{
  int32_t tmp;
  objnum *__dest;
  
  *dstp = val->runstyp;
  if (val->runstyp - 1 < 0xd) {
    __dest = (objnum *)(dstp + 1);
    switch((uint)val->runstyp) {
    case 1:
      *(undefined4 *)__dest = *(undefined4 *)&val->runsv;
      return;
    case 2:
    case 10:
    case 0xd:
      *__dest = (val->runsv).runsvobj;
      break;
    case 3:
    case 7:
      memcpy(__dest,(val->runsv).runsvstr,(ulong)*(ushort *)(val->runsv).runsvstr);
      return;
    }
  }
  return;
}

Assistant:

static void runputbuf(uchar *dstp, runsdef *val)
{
    *dstp++ = val->runstyp;
    switch(val->runstyp)
    {
    case DAT_LIST:
    case DAT_SSTRING:
        memcpy(dstp, val->runsv.runsvstr, (size_t)osrp2(val->runsv.runsvstr));
        break;
        
    case DAT_NUMBER:
        oswp4s(dstp, val->runsv.runsvnum);
        break;
        
    case DAT_PROPNUM:
        oswp2(dstp, val->runsv.runsvprp);
        break;
        
    case DAT_OBJECT:
    case DAT_FNADDR:
        oswp2(dstp, val->runsv.runsvobj);
        break;
    }
}